

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutput.cpp
# Opt level: O1

void __thiscall
Test::TextOutput::finishTestMethod
          (TextOutput *this,string *suiteName,string *methodName,string *argString,bool withSuccess)

{
  pointer pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  if (this->mode < 2 || this->mode == 2 && !withSuccess) {
    poVar2 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Test-method \'",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(methodName->_M_dataplus)._M_p,methodName->_M_string_length);
    local_40 = (char *)CONCAT71(local_40._1_7_,0x28);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_40,1);
    local_40 = local_30;
    if (argString->_M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    }
    else {
      pcVar1 = (argString->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + argString->_M_string_length);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\' finished with ",0x11);
    pcVar3 = "errors!";
    if (withSuccess) {
      pcVar3 = "success!";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,(ulong)withSuccess + 7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return;
}

Assistant:

void TextOutput::finishTestMethod(
    const std::string &suiteName, const std::string &methodName, const std::string &argString, const bool withSuccess) {
  if (mode <= Debug || (mode <= Verbose && !withSuccess))
    stream << "Test-method '" << methodName << '(' << (argString.empty() ? "" : argString) << ")' finished with "
           << (withSuccess ? "success!" : "errors!") << std::endl;
}